

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O1

Accel * __thiscall
embree::BVH4Factory::BVH4Instance
          (BVH4Factory *this,Scene *scene,bool isExpensive,BuildVariant bvariant)

{
  int iVar1;
  BVHN<4> *this_00;
  undefined8 *puVar2;
  long *plVar3;
  Builder *pBVar4;
  Accel *pAVar5;
  long *plVar6;
  GTypeMask GVar7;
  Intersectors intersectors;
  Intersector16 local_188;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  BVHN<4> *local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  Intersector1 local_128;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  char *local_f8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  IntersectFunc16 local_78;
  OccludedFunc16 p_Stack_70;
  char *local_68;
  
  this_00 = (BVHN<4> *)alignedMalloc(0x240,0x10);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&InstancePrimitive::type,scene);
  local_128.intersect = (IntersectFunc)0x0;
  local_128.occluded = (OccludedFunc)0x0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = (BVHN<4> *)0x0;
  uStack_140 = 0;
  memset(&local_128.name,0,0xe0);
  local_148 = this_00;
  (*this->BVH4InstanceIntersector1)(&local_128);
  (*this->BVH4InstanceIntersector4Chunk)((Intersector4 *)&local_188);
  local_f8 = local_188.name;
  local_108 = local_188.intersect._0_4_;
  uStack_104 = local_188.intersect._4_4_;
  uStack_100 = local_188.occluded._0_4_;
  uStack_fc = local_188.occluded._4_4_;
  (*this->BVH4InstanceIntersector8Chunk)((Intersector8 *)&local_188);
  local_b0 = local_188.name;
  local_c0 = local_188.intersect._0_4_;
  uStack_bc = local_188.intersect._4_4_;
  uStack_b8 = local_188.occluded._0_4_;
  uStack_b4 = local_188.occluded._4_4_;
  (*this->BVH4InstanceIntersector16Chunk)(&local_188);
  local_68 = local_188.name;
  local_78 = local_188.intersect;
  p_Stack_70 = local_188.occluded;
  GVar7 = (ulong)((uint)isExpensive << 0x1e) + MTY_INSTANCE_CHEAP;
  iVar1 = std::__cxx11::string::compare
                    ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
  if (iVar1 == 0) {
    if (bvariant != STATIC) {
      if (bvariant != DYNAMIC) {
        pBVar4 = (Builder *)0x0;
        goto LAB_00c767c0;
      }
      goto LAB_00c76799;
    }
  }
  else {
    iVar1 = std::__cxx11::string::compare
                      ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare
                        ((char *)(*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
      if (iVar1 != 0) {
        puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
        std::operator+(&local_168,"unknown builder ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (*(long *)&(scene->super_AccelN).field_0x188 + 0x330));
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_168);
        local_188.intersect = (IntersectFunc16)*plVar3;
        plVar6 = plVar3 + 2;
        if (local_188.intersect == (IntersectFunc16)plVar6) {
          local_188.name = (char *)*plVar6;
          uStack_170 = (undefined4)plVar3[3];
          uStack_16c = *(undefined4 *)((long)plVar3 + 0x1c);
          local_188.intersect = (IntersectFunc16)&local_188.name;
        }
        else {
          local_188.name = (char *)*plVar6;
        }
        local_188.occluded = (OccludedFunc16)plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        *puVar2 = &PTR__rtcore_error_022018b0;
        *(undefined4 *)(puVar2 + 1) = 2;
        puVar2[2] = puVar2 + 4;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(puVar2 + 2),local_188.intersect,
                   local_188.occluded + (long)local_188.intersect);
        __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
      }
LAB_00c76799:
      pBVar4 = (*this->BVH4BuilderTwoLevelInstanceSAH)(this_00,scene,GVar7,false);
      goto LAB_00c767c0;
    }
  }
  pBVar4 = (*this->BVH4InstanceSceneBuilderSAH)(this_00,scene,GVar7);
LAB_00c767c0:
  pAVar5 = (Accel *)alignedMalloc(0x180,0x10);
  (pAVar5->super_AccelData).super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(pAVar5->super_AccelData).bounds.bounds0.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar5->super_AccelData).bounds.bounds0.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar5->super_AccelData).bounds.bounds0.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar5->super_AccelData).bounds.bounds0.upper.field_0 + 8) =
       0xff800000ff800000;
  *(undefined8 *)&(pAVar5->super_AccelData).bounds.bounds1.lower.field_0 = 0x7f8000007f800000;
  *(undefined8 *)((long)&(pAVar5->super_AccelData).bounds.bounds1.lower.field_0 + 8) =
       0x7f8000007f800000;
  *(undefined8 *)&(pAVar5->super_AccelData).bounds.bounds1.upper.field_0 = 0xff800000ff800000;
  *(undefined8 *)((long)&(pAVar5->super_AccelData).bounds.bounds1.upper.field_0 + 8) =
       0xff800000ff800000;
  (pAVar5->super_AccelData).type = TY_ACCEL_INSTANCE;
  (pAVar5->super_AccelData).super_RefCount._vptr_RefCount = (_func_int **)&PTR__RefCount_02207ae8;
  memcpy(&(pAVar5->super_AccelData).field_0x58,&local_148,0x118);
  (pAVar5->super_AccelData).super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AccelInstance_02207a80;
  pAVar5[1].super_AccelData.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  pAVar5[1].super_AccelData.super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)pBVar4;
  return pAVar5;
}

Assistant:

Accel* BVH4Factory::BVH4Instance(Scene* scene, bool isExpensive, BuildVariant bvariant)
  {
    BVH4* accel = new BVH4(InstancePrimitive::type,scene);
    Accel::Intersectors intersectors = BVH4InstanceIntersectors(accel);
    auto gtype = isExpensive ? Geometry::MTY_INSTANCE_EXPENSIVE : Geometry::MTY_INSTANCE_CHEAP;
    // Builder* builder = BVH4InstanceSceneBuilderSAH(accel,scene,gtype);

    Builder* builder = nullptr;
    if (scene->device->object_builder == "default") {
      switch (bvariant) {
      case BuildVariant::STATIC      : builder = BVH4InstanceSceneBuilderSAH(accel,scene,gtype); break;
      case BuildVariant::DYNAMIC     : builder = BVH4BuilderTwoLevelInstanceSAH(accel,scene,gtype,false); break;
      case BuildVariant::HIGH_QUALITY: assert(false); break;
      }
    }
    else if (scene->device->object_builder == "sah") builder = BVH4InstanceSceneBuilderSAH(accel,scene,gtype);
    else if (scene->device->object_builder == "dynamic") builder = BVH4BuilderTwoLevelInstanceSAH(accel,scene,gtype,false);
    else throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"unknown builder "+scene->device->object_builder+" for BVH4<Object>");

    return new AccelInstance(accel,builder,intersectors);
  }